

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_7zip.c
# Opt level: O1

void test_read_format_7zip_win_attrib(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a;
  char *pcVar4;
  archive_entry *ae;
  archive_entry *local_38;
  
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                   ,L'Ҳ',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_lzma((archive *)a);
  if (iVar1 == 0) {
    iVar1 = archive_read_support_format_all((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'һ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
    extract_reference_file("test_read_format_7zip_win_attrib.7z");
    wVar2 = archive_read_open_filename(a,"test_read_format_7zip_win_attrib.7z",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'ӊ',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",a);
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'ӎ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'ӏ',"hidden_dir/","\"hidden_dir/\"",pcVar4,"archive_entry_pathname(ae)",
               (void *)0x0,L'\0');
    mVar3 = archive_entry_mode(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'Ӑ',0x41ed,"(AE_IFDIR | 0755)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_fflags_text(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'ӑ',"hidden","\"hidden\"",pcVar4,"archive_entry_fflags_text(ae)",(void *)0x0,L'\0'
              );
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'ӓ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'Ӕ',"readonly_dir/","\"readonly_dir/\"",pcVar4,"archive_entry_pathname(ae)",
               (void *)0x0,L'\0');
    mVar3 = archive_entry_mode(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'ӕ',0x416d,"(AE_IFDIR | 0555)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_fflags_text(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'Ӗ',"rdonly","\"rdonly\"",pcVar4,"archive_entry_fflags_text(ae)",(void *)0x0,L'\0'
              );
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'Ә',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'ә',"regular_dir/","\"regular_dir/\"",pcVar4,"archive_entry_pathname(ae)",
               (void *)0x0,L'\0');
    mVar3 = archive_entry_mode(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'Ӛ',0x41ed,"(AE_IFDIR | 0755)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_fflags_text(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'ӛ',(char *)0x0,"NULL",pcVar4,"archive_entry_fflags_text(ae)",(void *)0x0,L'\0');
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'ӝ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'Ӟ',"system_dir/","\"system_dir/\"",pcVar4,"archive_entry_pathname(ae)",
               (void *)0x0,L'\0');
    mVar3 = archive_entry_mode(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'ӟ',0x41ed,"(AE_IFDIR | 0755)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_fflags_text(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'Ӡ',"system","\"system\"",pcVar4,"archive_entry_fflags_text(ae)",(void *)0x0,L'\0'
              );
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'Ӣ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'ӣ',"archive_file.txt","\"archive_file.txt\"",pcVar4,"archive_entry_pathname(ae)",
               (void *)0x0,L'\0');
    mVar3 = archive_entry_mode(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'Ӥ',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_fflags_text(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'ӥ',(char *)0x0,"NULL",pcVar4,"archive_entry_fflags_text(ae)",(void *)0x0,L'\0');
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'ӧ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'Ө',"hidden_file.txt","\"hidden_file.txt\"",pcVar4,"archive_entry_pathname(ae)",
               (void *)0x0,L'\0');
    mVar3 = archive_entry_mode(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'ө',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_fflags_text(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'Ӫ',"hidden","\"hidden\"",pcVar4,"archive_entry_fflags_text(ae)",(void *)0x0,L'\0'
              );
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'Ӭ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'ӭ',"readonly_file.txt","\"readonly_file.txt\"",pcVar4,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    mVar3 = archive_entry_mode(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'Ӯ',0x8124,"(AE_IFREG | 0444)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_fflags_text(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'ӯ',"rdonly","\"rdonly\"",pcVar4,"archive_entry_fflags_text(ae)",(void *)0x0,L'\0'
              );
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'ӱ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'Ӳ',"system_file.txt","\"system_file.txt\"",pcVar4,"archive_entry_pathname(ae)",
               (void *)0x0,L'\0');
    mVar3 = archive_entry_mode(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'ӳ',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_fflags_text(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'Ӵ',"system","\"system\"",pcVar4,"archive_entry_fflags_text(ae)",(void *)0x0,L'\0'
              );
    iVar1 = archive_read_free((archive *)a);
    wVar2 = L'ӷ';
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                   ,L'ҵ');
    test_skipping("7zip:lzma decoding is not supported on this platform");
    iVar1 = archive_read_free((archive *)a);
    wVar2 = L'ҷ';
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,wVar2,0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_7zip_win_attrib)
{
	struct archive *a;

	assert((a = archive_read_new()) != NULL);

	if (ARCHIVE_OK != archive_read_support_filter_lzma(a)) {
		skipping(
		    "7zip:lzma decoding is not supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
	}

	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));

	// This archive has four files and four directories:
	// * hidden directory
	// * readonly directory
	// * regular directory
	// * system directory
	// * regular "archive" file
	// * hidden file
	// * readonly file
	// * system file
	const char *refname = "test_read_format_7zip_win_attrib.7z";
	extract_reference_file(refname);

	assertEqualIntA(a, ARCHIVE_OK,
		archive_read_open_filename(a, refname, 10240));

	struct archive_entry *ae;

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("hidden_dir/", archive_entry_pathname(ae));
	assertEqualInt((AE_IFDIR | 0755), archive_entry_mode(ae));
	assertEqualString("hidden", archive_entry_fflags_text(ae));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("readonly_dir/", archive_entry_pathname(ae));
	assertEqualInt((AE_IFDIR | 0555), archive_entry_mode(ae));
	assertEqualString("rdonly", archive_entry_fflags_text(ae));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("regular_dir/", archive_entry_pathname(ae));
	assertEqualInt((AE_IFDIR | 0755), archive_entry_mode(ae));
	assertEqualString(NULL, archive_entry_fflags_text(ae));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("system_dir/", archive_entry_pathname(ae));
	assertEqualInt((AE_IFDIR | 0755), archive_entry_mode(ae));
	assertEqualString("system", archive_entry_fflags_text(ae));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("archive_file.txt", archive_entry_pathname(ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString(NULL, archive_entry_fflags_text(ae));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("hidden_file.txt", archive_entry_pathname(ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("hidden", archive_entry_fflags_text(ae));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("readonly_file.txt", archive_entry_pathname(ae));
	assertEqualInt((AE_IFREG | 0444), archive_entry_mode(ae));
	assertEqualString("rdonly", archive_entry_fflags_text(ae));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("system_file.txt", archive_entry_pathname(ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("system", archive_entry_fflags_text(ae));


	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}